

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ushort uVar1;
  int *piVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  parasail_result_t *ppVar20;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  short sVar40;
  uint uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  int16_t iVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [64];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  __m256i vMaxH;
  undefined1 local_280 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  short local_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short sStack_198;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short sStack_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  int16_t local_180;
  int16_t iStack_17e;
  int16_t iStack_17c;
  int16_t iStack_17a;
  int16_t iStack_178;
  int16_t iStack_176;
  int16_t iStack_174;
  int16_t iStack_172;
  int16_t iStack_170;
  int16_t iStack_16e;
  int16_t iStack_16c;
  int16_t iStack_16a;
  int16_t iStack_168;
  int16_t iStack_166;
  int16_t iStack_164;
  int16_t iStack_162;
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_diag_avx2_256_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_diag_avx2_256_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_diag_avx2_256_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar44 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_diag_avx2_256_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar44 = (ulong)(uint)matrix->length;
    }
    iVar19 = matrix->min;
    iVar25 = -iVar19;
    if (iVar19 != -open && SBORROW4(iVar19,-open) == iVar19 + open < 0) {
      iVar25 = open;
    }
    uVar29 = iVar25 - 0x7fff;
    sVar40 = 0x7ffe - (short)matrix->max;
    iVar46 = (int16_t)uVar29;
    local_160._2_2_ = iVar46;
    local_160._0_2_ = iVar46;
    local_160._4_2_ = iVar46;
    local_160._6_2_ = iVar46;
    local_160._8_2_ = iVar46;
    local_160._10_2_ = iVar46;
    local_160._12_2_ = iVar46;
    local_160._14_2_ = iVar46;
    local_160._16_2_ = iVar46;
    local_160._18_2_ = iVar46;
    local_160._20_2_ = iVar46;
    local_160._22_2_ = iVar46;
    local_160._24_2_ = iVar46;
    local_160._26_2_ = iVar46;
    local_160._28_2_ = iVar46;
    local_160._30_2_ = iVar46;
    local_220._2_2_ = iVar46;
    local_220._0_2_ = iVar46;
    local_220._4_2_ = iVar46;
    local_220._6_2_ = iVar46;
    local_220._8_2_ = iVar46;
    local_220._10_2_ = iVar46;
    local_220._12_2_ = iVar46;
    local_220._14_2_ = iVar46;
    local_220._16_2_ = iVar46;
    local_220._18_2_ = iVar46;
    local_220._20_2_ = iVar46;
    local_220._22_2_ = iVar46;
    local_220._24_2_ = iVar46;
    local_220._26_2_ = iVar46;
    local_220._28_2_ = iVar46;
    local_220._30_2_ = iVar46;
    local_1c0._2_2_ = iVar46;
    local_1c0._0_2_ = iVar46;
    local_1c0._4_2_ = iVar46;
    local_1c0._6_2_ = iVar46;
    local_1c0._8_2_ = iVar46;
    local_1c0._10_2_ = iVar46;
    local_1c0._12_2_ = iVar46;
    local_1c0._14_2_ = iVar46;
    local_1c0._16_2_ = iVar46;
    local_1c0._18_2_ = iVar46;
    local_1c0._20_2_ = iVar46;
    local_1c0._22_2_ = iVar46;
    local_1c0._24_2_ = iVar46;
    local_1c0._26_2_ = iVar46;
    local_1c0._28_2_ = iVar46;
    local_1c0._30_2_ = iVar46;
    local_180 = iVar46;
    iStack_17e = iVar46;
    iStack_17c = iVar46;
    iStack_17a = iVar46;
    iStack_178 = iVar46;
    iStack_176 = iVar46;
    iStack_174 = iVar46;
    iStack_172 = iVar46;
    iStack_170 = iVar46;
    iStack_16e = iVar46;
    iStack_16c = iVar46;
    iStack_16a = iVar46;
    iStack_168 = iVar46;
    iStack_166 = iVar46;
    iStack_164 = iVar46;
    iStack_162 = iVar46;
    ppVar20 = parasail_result_new();
    if (ppVar20 != (parasail_result_t *)0x0) {
      ppVar20->flag = ppVar20->flag | 0x10201004;
      uVar42 = (ulong)(s2Len + 0x1e);
      ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar42);
      ptr_00 = parasail_memalign_int16_t(0x20,uVar42);
      ptr_01 = parasail_memalign_int16_t(0x20,uVar42);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        uVar41 = (uint)uVar44;
        if (matrix->type == 0) {
          iVar19 = uVar41 + 0xf;
          ptr_02 = parasail_memalign_int16_t(0x20,(long)iVar19);
          if (ptr_02 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar41) {
            piVar2 = matrix->mapper;
            uVar42 = 0;
            do {
              ptr_02[uVar42] = (int16_t)piVar2[(byte)_s1[uVar42]];
              uVar42 = uVar42 + 1;
            } while (uVar44 != uVar42);
          }
          iVar25 = uVar41 + 1;
          if ((int)(uVar41 + 1) < iVar19) {
            iVar25 = iVar19;
          }
          memset(ptr_02 + (int)uVar41,0,(ulong)(~uVar41 + iVar25) * 2 + 2);
        }
        else {
          ptr_02 = (int16_t *)0x0;
        }
        uVar16 = s2Len + 0xf;
        auVar5._2_2_ = iStack_17e;
        auVar5._0_2_ = local_180;
        auVar5._4_2_ = iStack_17c;
        auVar5._6_2_ = iStack_17a;
        auVar5._8_2_ = iStack_178;
        auVar5._10_2_ = iStack_176;
        auVar5._12_2_ = iStack_174;
        auVar5._14_2_ = iStack_172;
        auVar10._16_2_ = iStack_170;
        auVar10._0_16_ = auVar5;
        auVar10._18_2_ = iStack_16e;
        auVar10._20_2_ = iStack_16c;
        auVar10._22_2_ = iStack_16a;
        auVar10._24_2_ = iStack_168;
        auVar10._26_2_ = iStack_166;
        auVar10._28_2_ = iStack_164;
        auVar10._30_2_ = iStack_162;
        auVar47 = vpslldq_avx2(ZEXT1632(auVar5),0xe);
        local_100 = vpblendw_avx2(auVar10,auVar47,0x80);
        local_80 = (undefined2)open;
        local_a0 = (undefined2)gap;
        local_120 = (undefined2)uVar44;
        local_c0 = (undefined2)s2Len;
        piVar2 = matrix->mapper;
        uVar42 = 1;
        if (1 < s2Len) {
          uVar42 = (ulong)(uint)s2Len;
        }
        uVar26 = 0;
        do {
          *(short *)(ptr[1] + uVar26 * 2 + 0xe) = (short)piVar2[(byte)_s2[uVar26]];
          uVar26 = uVar26 + 1;
        } while (uVar42 != uVar26);
        *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar15 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar16) {
          uVar15 = uVar16;
        }
        uVar26 = 0;
        local_1a0 = sVar40;
        sStack_19e = sVar40;
        sStack_19c = sVar40;
        sStack_19a = sVar40;
        sStack_198 = sVar40;
        sStack_196 = sVar40;
        sStack_194 = sVar40;
        sStack_192 = sVar40;
        sStack_190 = sVar40;
        sStack_18e = sVar40;
        sStack_18c = sVar40;
        sStack_18a = sVar40;
        sStack_188 = sVar40;
        sStack_186 = sVar40;
        sStack_184 = sVar40;
        sStack_182 = sVar40;
        uStack_11e = local_120;
        uStack_11c = local_120;
        uStack_11a = local_120;
        uStack_118 = local_120;
        uStack_116 = local_120;
        uStack_114 = local_120;
        uStack_112 = local_120;
        uStack_110 = local_120;
        uStack_10e = local_120;
        uStack_10c = local_120;
        uStack_10a = local_120;
        uStack_108 = local_120;
        uStack_106 = local_120;
        uStack_104 = local_120;
        uStack_102 = local_120;
        uStack_be = local_c0;
        uStack_bc = local_c0;
        uStack_ba = local_c0;
        uStack_b8 = local_c0;
        uStack_b6 = local_c0;
        uStack_b4 = local_c0;
        uStack_b2 = local_c0;
        uStack_b0 = local_c0;
        uStack_ae = local_c0;
        uStack_ac = local_c0;
        uStack_aa = local_c0;
        uStack_a8 = local_c0;
        uStack_a6 = local_c0;
        uStack_a4 = local_c0;
        uStack_a2 = local_c0;
        uStack_9e = local_a0;
        uStack_9c = local_a0;
        uStack_9a = local_a0;
        uStack_98 = local_a0;
        uStack_96 = local_a0;
        uStack_94 = local_a0;
        uStack_92 = local_a0;
        uStack_90 = local_a0;
        uStack_8e = local_a0;
        uStack_8c = local_a0;
        uStack_8a = local_a0;
        uStack_88 = local_a0;
        uStack_86 = local_a0;
        uStack_84 = local_a0;
        uStack_82 = local_a0;
        uStack_7e = local_80;
        uStack_7c = local_80;
        uStack_7a = local_80;
        uStack_78 = local_80;
        uStack_76 = local_80;
        uStack_74 = local_80;
        uStack_72 = local_80;
        uStack_70 = local_80;
        uStack_6e = local_80;
        uStack_6c = local_80;
        uStack_6a = local_80;
        uStack_68 = local_80;
        uStack_66 = local_80;
        uStack_64 = local_80;
        uStack_62 = local_80;
        memset(ptr[1] + (ulong)(uint)s2Len * 2 + 0xe,0,(ulong)(~s2Len + uVar15) * 2 + 2);
        do {
          ptr_00[uVar26 + 0xf] = 0;
          ptr_01[uVar26 + 0xf] = iVar46;
          uVar26 = uVar26 + 1;
        } while (uVar42 != uVar26);
        lVar21 = 0;
        do {
          ptr_00[lVar21] = iVar46;
          ptr_01[lVar21] = iVar46;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0xf);
        lVar21 = (ulong)(uint)s2Len + 0xf;
        auVar47._2_2_ = iStack_17e;
        auVar47._0_2_ = local_180;
        auVar47._4_2_ = iStack_17c;
        auVar47._6_2_ = iStack_17a;
        auVar47._8_2_ = iStack_178;
        auVar47._10_2_ = iStack_176;
        auVar47._12_2_ = iStack_174;
        auVar47._14_2_ = iStack_172;
        auVar47._16_2_ = iStack_170;
        auVar47._18_2_ = iStack_16e;
        auVar47._20_2_ = iStack_16c;
        auVar47._22_2_ = iStack_16a;
        auVar47._24_2_ = iStack_168;
        auVar47._26_2_ = iStack_166;
        auVar47._28_2_ = iStack_164;
        auVar47._30_2_ = iStack_162;
        auVar52 = ZEXT3264(auVar47);
        do {
          ptr_00[lVar21] = iVar46;
          ptr_01[lVar21] = iVar46;
          lVar21 = lVar21 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar16);
        auVar48 = ZEXT3264(local_220);
        if ((int)uVar41 < 1) {
          local_1e0 = auVar47;
          local_200._2_2_ = sStack_19e;
          local_200._0_2_ = local_1a0;
          local_200._4_2_ = sStack_19c;
          local_200._6_2_ = sStack_19a;
          local_200._10_2_ = sStack_196;
          local_200._8_2_ = sStack_198;
          local_200._12_2_ = sStack_194;
          local_200._14_2_ = sStack_192;
          local_200._18_2_ = sStack_18e;
          local_200._16_2_ = sStack_190;
          local_200._20_2_ = sStack_18c;
          local_200._22_2_ = sStack_18a;
          local_200._26_2_ = sStack_186;
          local_200._24_2_ = sStack_188;
          local_200._28_2_ = sStack_184;
          local_200._30_2_ = sStack_182;
        }
        else {
          piVar2 = matrix->matrix;
          iVar19 = matrix->size;
          iVar25 = matrix->type;
          uVar41 = uVar41 - 1;
          uVar42 = 1;
          if (1 < (int)uVar16) {
            uVar42 = (ulong)uVar16;
          }
          local_280._8_8_ = 0x80009000a000b;
          local_280._0_8_ = 0xc000d000e000f;
          local_280._16_8_ = 0x4000500060007;
          local_280._24_8_ = 0x100020003;
          uVar26 = 0;
          local_e0 = 1;
          uStack_de = 1;
          uStack_dc = 1;
          uStack_da = 1;
          uStack_d8 = 1;
          uStack_d6 = 1;
          uStack_d4 = 1;
          uStack_d2 = 1;
          uStack_d0 = 1;
          uStack_ce = 1;
          uStack_cc = 1;
          uStack_ca = 1;
          uStack_c8 = 1;
          uStack_c6 = 1;
          uStack_c4 = 1;
          uStack_c2 = 1;
          local_140 = 0x10;
          uStack_13e = 0x10;
          uStack_13c = 0x10;
          uStack_13a = 0x10;
          uStack_138 = 0x10;
          uStack_136 = 0x10;
          uStack_134 = 0x10;
          uStack_132 = 0x10;
          uStack_130 = 0x10;
          uStack_12e = 0x10;
          uStack_12c = 0x10;
          uStack_12a = 0x10;
          uStack_128 = 0x10;
          uStack_126 = 0x10;
          uStack_124 = 0x10;
          uStack_122 = 0x10;
          local_200._2_2_ = sStack_19e;
          local_200._0_2_ = local_1a0;
          local_200._4_2_ = sStack_19c;
          local_200._6_2_ = sStack_19a;
          local_200._10_2_ = sStack_196;
          local_200._8_2_ = sStack_198;
          local_200._12_2_ = sStack_194;
          local_200._14_2_ = sStack_192;
          local_200._18_2_ = sStack_18e;
          local_200._16_2_ = sStack_190;
          local_200._20_2_ = sStack_18c;
          local_200._22_2_ = sStack_18a;
          local_200._26_2_ = sStack_186;
          local_200._24_2_ = sStack_188;
          local_200._28_2_ = sStack_184;
          local_200._30_2_ = sStack_182;
          local_1e0 = auVar47;
          do {
            uVar15 = (uint)uVar26;
            uVar16 = uVar15;
            if (iVar25 == 0) {
              uVar16 = (uint)ptr_02[uVar26];
            }
            if (iVar25 == 0) {
              uVar22 = (int)ptr_02[uVar26 | 1];
            }
            else {
              uVar22 = uVar15 | 1;
              if (uVar44 <= (uVar26 | 1)) {
                uVar22 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar27 = (int)ptr_02[uVar26 | 2];
            }
            else {
              uVar27 = uVar15 | 2;
              if (uVar44 <= (uVar26 | 2)) {
                uVar27 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar30 = (int)ptr_02[uVar26 | 3];
            }
            else {
              uVar30 = uVar15 | 3;
              if (uVar44 <= (uVar26 | 3)) {
                uVar30 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar31 = (int)ptr_02[uVar26 | 4];
            }
            else {
              uVar31 = uVar15 | 4;
              if (uVar44 <= (uVar26 | 4)) {
                uVar31 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar17 = (int)ptr_02[uVar26 | 5];
            }
            else {
              uVar17 = uVar15 | 5;
              if (uVar44 <= (uVar26 | 5)) {
                uVar17 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar23 = (int)ptr_02[uVar26 | 6];
            }
            else {
              uVar23 = uVar15 | 6;
              if (uVar44 <= (uVar26 | 6)) {
                uVar23 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar28 = (int)ptr_02[uVar26 | 7];
            }
            else {
              uVar28 = uVar15 | 7;
              if (uVar44 <= (uVar26 | 7)) {
                uVar28 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar33 = (int)ptr_02[uVar26 | 8];
            }
            else {
              uVar33 = uVar15 | 8;
              if (uVar44 <= (uVar26 | 8)) {
                uVar33 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar36 = (int)ptr_02[uVar26 | 9];
            }
            else {
              uVar36 = uVar15 | 9;
              if (uVar44 <= (uVar26 | 9)) {
                uVar36 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar45 = (int)ptr_02[uVar26 | 10];
            }
            else {
              uVar45 = uVar15 | 10;
              if (uVar44 <= (uVar26 | 10)) {
                uVar45 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar39 = (int)ptr_02[uVar26 | 0xb];
            }
            else {
              uVar39 = uVar15 | 0xb;
              if (uVar44 <= (uVar26 | 0xb)) {
                uVar39 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar37 = (int)ptr_02[uVar26 | 0xc];
            }
            else {
              uVar37 = uVar15 | 0xc;
              if (uVar44 <= (uVar26 | 0xc)) {
                uVar37 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar35 = (int)ptr_02[uVar26 | 0xd];
            }
            else {
              uVar35 = uVar15 | 0xd;
              if (uVar44 <= (uVar26 | 0xd)) {
                uVar35 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar38 = (int)ptr_02[uVar26 | 0xe];
            }
            else {
              uVar38 = uVar15 | 0xe;
              if (uVar44 <= (uVar26 | 0xe)) {
                uVar38 = uVar41;
              }
            }
            if (iVar25 == 0) {
              uVar15 = (int)ptr_02[uVar26 | 0xf];
            }
            else {
              uVar15 = uVar15 | 0xf;
              if (uVar44 <= (uVar26 | 0xf)) {
                uVar15 = uVar41;
              }
            }
            auVar11._2_2_ = uStack_11e;
            auVar11._0_2_ = local_120;
            auVar11._4_2_ = uStack_11c;
            auVar11._6_2_ = uStack_11a;
            auVar11._8_2_ = uStack_118;
            auVar11._10_2_ = uStack_116;
            auVar11._12_2_ = uStack_114;
            auVar11._14_2_ = uStack_112;
            auVar11._16_2_ = uStack_110;
            auVar11._18_2_ = uStack_10e;
            auVar11._20_2_ = uStack_10c;
            auVar11._22_2_ = uStack_10a;
            auVar11._24_2_ = uStack_108;
            auVar11._26_2_ = uStack_106;
            auVar11._28_2_ = uStack_104;
            auVar11._30_2_ = uStack_102;
            auVar8 = vpcmpgtw_avx2(auVar11,local_280);
            auVar10 = vpmovsxbw_avx2(_DAT_008d4a94);
            auVar51 = auVar52._0_32_;
            uVar43 = 0;
            auVar11 = local_100;
            auVar7 = local_100;
            auVar12 = auVar51;
            do {
              auVar5 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar28 * iVar19) +
                                                        (long)*(short *)(ptr[1] + uVar43 * 2)]),
                                   (uint)*(ushort *)
                                          (piVar2 + (long)(int)(uVar23 * iVar19) +
                                                    (long)*(short *)(ptr[1] + uVar43 * 2 + 2)),1);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar17 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 + 4)
                                                 ),2);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar31 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 + 6)
                                                 ),3);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar30 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 + 8)
                                                 ),4);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar27 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 + 10
                                                                           )),5);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar22 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 +
                                                                                     0xc)),6);
              auVar5 = vpinsrw_avx(auVar5,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar16 * iVar19) +
                                                           (long)*(short *)(ptr[1] + uVar43 * 2 +
                                                                                     0xe)),7);
              auVar6 = vpinsrw_avx(ZEXT416((uint)piVar2[(long)(int)(uVar15 * iVar19) +
                                                        (long)*(short *)(*ptr + uVar43 * 2)]),
                                   (uint)*(ushort *)
                                          (piVar2 + (long)(int)(uVar38 * iVar19) +
                                                    (long)*(short *)(*ptr + uVar43 * 2 + 2)),1);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar35 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 4)),
                                   2);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar37 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 6)),
                                   3);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar39 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 8)),
                                   4);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar45 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 10))
                                   ,5);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar36 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 0xc)
                                                 ),6);
              auVar6 = vpinsrw_avx(auVar6,(uint)*(ushort *)
                                                 (piVar2 + (long)(int)(uVar33 * iVar19) +
                                                           (long)*(short *)(*ptr + uVar43 * 2 + 0xe)
                                                 ),7);
              auVar49._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar6;
              auVar49._16_16_ = ZEXT116(1) * auVar5;
              auVar47 = vpaddsw_avx2(auVar7,auVar49);
              iVar46 = ptr_00[uVar43 + 0xf];
              auVar53._2_2_ = iVar46;
              auVar53._0_2_ = iVar46;
              auVar53._4_2_ = iVar46;
              auVar53._6_2_ = iVar46;
              auVar53._8_2_ = iVar46;
              auVar53._10_2_ = iVar46;
              auVar53._12_2_ = iVar46;
              auVar53._14_2_ = iVar46;
              auVar53._16_2_ = iVar46;
              auVar53._18_2_ = iVar46;
              auVar53._20_2_ = iVar46;
              auVar53._22_2_ = iVar46;
              auVar53._24_2_ = iVar46;
              auVar53._26_2_ = iVar46;
              auVar53._28_2_ = iVar46;
              auVar53._30_2_ = iVar46;
              auVar7 = vpalignr_avx2(ZEXT1632(auVar11._16_16_),auVar11,2);
              auVar49 = vpblendw_avx2(auVar7,auVar53,0x80);
              auVar7 = vpblendd_avx2(auVar7,auVar49,0xf0);
              auVar51 = vpalignr_avx2(ZEXT1632(auVar51._16_16_),auVar51,2);
              iVar46 = ptr_01[uVar43 + 0xf];
              auVar54._2_2_ = iVar46;
              auVar54._0_2_ = iVar46;
              auVar54._4_2_ = iVar46;
              auVar54._6_2_ = iVar46;
              auVar54._8_2_ = iVar46;
              auVar54._10_2_ = iVar46;
              auVar54._12_2_ = iVar46;
              auVar54._14_2_ = iVar46;
              auVar54._16_2_ = iVar46;
              auVar54._18_2_ = iVar46;
              auVar54._20_2_ = iVar46;
              auVar54._22_2_ = iVar46;
              auVar54._24_2_ = iVar46;
              auVar54._26_2_ = iVar46;
              auVar54._28_2_ = iVar46;
              auVar54._30_2_ = iVar46;
              auVar49 = vpblendw_avx2(auVar51,auVar54,0x80);
              auVar49 = vpblendd_avx2(auVar51,auVar49,0xf0);
              auVar50._2_2_ = uStack_7e;
              auVar50._0_2_ = local_80;
              auVar50._4_2_ = uStack_7c;
              auVar50._6_2_ = uStack_7a;
              auVar50._8_2_ = uStack_78;
              auVar50._10_2_ = uStack_76;
              auVar50._12_2_ = uStack_74;
              auVar50._14_2_ = uStack_72;
              auVar50._16_2_ = uStack_70;
              auVar50._18_2_ = uStack_6e;
              auVar50._20_2_ = uStack_6c;
              auVar50._22_2_ = uStack_6a;
              auVar50._24_2_ = uStack_68;
              auVar50._26_2_ = uStack_66;
              auVar50._28_2_ = uStack_64;
              auVar50._30_2_ = uStack_62;
              auVar51 = vpsubsw_avx2(auVar7,auVar50);
              auVar9._2_2_ = uStack_9e;
              auVar9._0_2_ = local_a0;
              auVar9._4_2_ = uStack_9c;
              auVar9._6_2_ = uStack_9a;
              auVar9._8_2_ = uStack_98;
              auVar9._10_2_ = uStack_96;
              auVar9._12_2_ = uStack_94;
              auVar9._14_2_ = uStack_92;
              auVar9._16_2_ = uStack_90;
              auVar9._18_2_ = uStack_8e;
              auVar9._20_2_ = uStack_8c;
              auVar9._22_2_ = uStack_8a;
              auVar9._24_2_ = uStack_88;
              auVar9._26_2_ = uStack_86;
              auVar9._28_2_ = uStack_84;
              auVar9._30_2_ = uStack_82;
              auVar49 = vpsubsw_avx2(auVar49,auVar9);
              auVar51 = vpmaxsw_avx2(auVar51,auVar49);
              auVar11 = vpsubsw_avx2(auVar11,auVar50);
              auVar12 = vpsubsw_avx2(auVar12,auVar9);
              auVar49 = vpmaxsw_avx2(auVar11,auVar12);
              auVar11 = vpmaxsw_avx2(auVar49,auVar51);
              auVar11 = vpmaxsw_avx2(auVar11,_DAT_008d4700);
              auVar47 = vpmaxsw_avx2(auVar11,auVar47);
              auVar12 = vpcmpeqw_avx2(auVar10,_DAT_008d4ac0);
              auVar11 = vpandn_avx2(auVar12,auVar47);
              auVar51 = vpblendvb_avx2(auVar51,auVar52._0_32_,auVar12);
              if (0xf < uVar43) {
                local_200 = vpminsw_avx2(auVar11,local_200);
                local_1e0 = vpmaxsw_avx2(auVar11,local_1e0);
              }
              vpextrw_avx(auVar11._0_16_,0);
              vpextrw_avx(auVar51._0_16_,0);
              auVar14._2_2_ = uStack_be;
              auVar14._0_2_ = local_c0;
              auVar14._4_2_ = uStack_bc;
              auVar14._6_2_ = uStack_ba;
              auVar14._8_2_ = uStack_b8;
              auVar14._10_2_ = uStack_b6;
              auVar14._12_2_ = uStack_b4;
              auVar14._14_2_ = uStack_b2;
              auVar14._16_2_ = uStack_b0;
              auVar14._18_2_ = uStack_ae;
              auVar14._20_2_ = uStack_ac;
              auVar14._22_2_ = uStack_aa;
              auVar14._24_2_ = uStack_a8;
              auVar14._26_2_ = uStack_a6;
              auVar14._28_2_ = uStack_a4;
              auVar14._30_2_ = uStack_a2;
              auVar9 = vpcmpgtw_avx2(auVar14,auVar10);
              auVar9 = vpand_avx2(auVar9,auVar8);
              auVar50 = vpsraw_avx2(auVar10,0xf);
              auVar50 = vpandn_avx2(auVar50,auVar9);
              auVar5 = vpacksswb_avx(auVar50._0_16_,auVar50._16_16_);
              auVar53 = vpcmpeqw_avx2(auVar11,local_160);
              auVar54 = vpcmpgtw_avx2(auVar11,local_160);
              auVar9 = vpand_avx2(auVar54,auVar50);
              auVar6 = vpacksswb_avx(auVar9._0_16_,auVar9._16_16_);
              local_160 = vpblendvb_avx2(local_160,auVar47,auVar9);
              auVar47 = vpcmpgtw_avx2(local_1c0,auVar10);
              auVar9 = vpand_avx2(auVar47,auVar53);
              auVar4 = vpacksswb_avx(auVar9._0_16_,auVar9._16_16_);
              auVar5 = vpblendvb_avx(auVar6,auVar5,auVar4);
              auVar52 = ZEXT3264(auVar47);
              auVar12 = vpblendvb_avx2(auVar49,auVar47,auVar12);
              auVar49 = vpmovsxbw_avx2(auVar5);
              local_220 = vpblendvb_avx2(auVar48._0_32_,local_280,auVar49);
              auVar48 = ZEXT3264(local_220);
              auVar49 = vpor_avx2(auVar9,auVar54);
              auVar49 = vpand_avx2(auVar50,auVar49);
              local_1c0 = vpblendvb_avx2(local_1c0,auVar10,auVar49);
              auVar13._8_2_ = 1;
              auVar13._0_8_ = 0x1000100010001;
              auVar13._10_2_ = 1;
              auVar13._12_2_ = 1;
              auVar13._14_2_ = 1;
              auVar13._16_2_ = 1;
              auVar13._18_2_ = 1;
              auVar13._20_2_ = 1;
              auVar13._22_2_ = 1;
              auVar13._24_2_ = 1;
              auVar13._26_2_ = 1;
              auVar13._28_2_ = 1;
              auVar13._30_2_ = 1;
              auVar10 = vpaddsw_avx2(auVar10,auVar13);
              uVar43 = uVar43 + 1;
            } while (uVar42 != uVar43);
            auVar51._8_2_ = 0x10;
            auVar51._0_8_ = 0x10001000100010;
            auVar51._10_2_ = 0x10;
            auVar51._12_2_ = 0x10;
            auVar51._14_2_ = 0x10;
            auVar51._16_2_ = 0x10;
            auVar51._18_2_ = 0x10;
            auVar51._20_2_ = 0x10;
            auVar51._22_2_ = 0x10;
            auVar51._24_2_ = 0x10;
            auVar51._26_2_ = 0x10;
            auVar51._28_2_ = 0x10;
            auVar51._30_2_ = 0x10;
            local_280 = vpaddsw_avx2(local_280,auVar51);
            uVar26 = uVar26 + 0x10;
          } while (uVar26 < uVar44);
        }
        lVar21 = 0;
        iVar18 = 0;
        iVar19 = 0;
        iVar24 = 0;
        iVar25 = 0;
        do {
          uVar1 = *(ushort *)(local_160 + lVar21 * 2);
          if ((short)(ushort)uVar29 < (short)uVar1) {
            uVar29 = (uint)uVar1;
            iVar19 = (int)*(short *)(local_220 + lVar21 * 2);
            iVar25 = (int)*(short *)(local_1c0 + lVar21 * 2);
            iVar24 = (int)*(short *)(local_1c0 + lVar21 * 2);
            iVar18 = (int)*(short *)(local_220 + lVar21 * 2);
          }
          else if (uVar1 == (ushort)uVar29) {
            iVar32 = (int)*(short *)(local_1c0 + lVar21 * 2);
            if (iVar32 < iVar25) {
              iVar19 = (int)*(short *)(local_220 + lVar21 * 2);
              iVar25 = iVar32;
              iVar24 = iVar32;
              iVar18 = (int)*(short *)(local_220 + lVar21 * 2);
            }
            else if (iVar25 == iVar32) {
              iVar34 = (int)*(short *)(local_220 + lVar21 * 2);
              iVar25 = iVar24;
              if (iVar34 < iVar19) {
                iVar25 = iVar32;
              }
              bVar3 = iVar34 <= iVar19;
              iVar19 = iVar18;
              iVar24 = iVar25;
              if (bVar3) {
                iVar19 = iVar34;
                iVar18 = iVar34;
              }
            }
          }
          sVar40 = (short)uVar29;
          lVar21 = lVar21 + 1;
        } while ((int)lVar21 != 0x10);
        auVar10 = vpcmpgtw_avx2(auVar47,local_200);
        auVar12._2_2_ = sStack_19e;
        auVar12._0_2_ = local_1a0;
        auVar12._4_2_ = sStack_19c;
        auVar12._6_2_ = sStack_19a;
        auVar12._8_2_ = sStack_198;
        auVar12._10_2_ = sStack_196;
        auVar12._12_2_ = sStack_194;
        auVar12._14_2_ = sStack_192;
        auVar12._16_2_ = sStack_190;
        auVar12._18_2_ = sStack_18e;
        auVar12._20_2_ = sStack_18c;
        auVar12._22_2_ = sStack_18a;
        auVar12._24_2_ = sStack_188;
        auVar12._26_2_ = sStack_186;
        auVar12._28_2_ = sStack_184;
        auVar12._30_2_ = sStack_182;
        auVar47 = vpcmpgtw_avx2(local_1e0,auVar12);
        auVar10 = vpor_avx2(auVar10,auVar47);
        if ((((((((((((((((((((((((((((((((auVar10 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar10 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar10 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar10 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar10 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar10 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar10 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar10 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar10 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar10 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar10 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar10 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar10 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar10 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar10 >> 0x7f,0) != '\0') ||
                          (auVar10 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar10 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar10 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar10 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar10 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
          sVar40 = 0;
          iVar25 = 0;
          iVar19 = 0;
        }
        ppVar20->score = (int)sVar40;
        ppVar20->end_query = iVar19;
        ppVar20->end_ref = iVar25;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(ptr_02);
          return ppVar20;
        }
        return ppVar20;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}